

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O0

int __thiscall
gl4cts::SparseTextureClampTests::init(SparseTextureClampTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  int extraout_EAX;
  ShaderExtensionTestCase *this_00;
  TestNode *pTVar1;
  allocator<char> local_31;
  string local_30;
  SparseTextureClampTests *local_10;
  SparseTextureClampTests *this_local;
  
  local_10 = this;
  this_00 = (ShaderExtensionTestCase *)operator_new(0x98);
  context = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"GL_ARB_sparse_texture_clamp",&local_31);
  ShaderExtensionTestCase::ShaderExtensionTestCase(this_00,context,&local_30);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  pTVar1 = (TestNode *)operator_new(0x278);
  SparseTextureClampLookupResidencyTestCase::SparseTextureClampLookupResidencyTestCase
            ((SparseTextureClampLookupResidencyTestCase *)pTVar1,
             (this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x278);
  SparseTextureClampLookupColorTestCase::SparseTextureClampLookupColorTestCase
            ((SparseTextureClampLookupColorTestCase *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void SparseTextureClampTests::init()
{
	addChild(new ShaderExtensionTestCase(m_context, "GL_ARB_sparse_texture_clamp"));
	addChild(new SparseTextureClampLookupResidencyTestCase(m_context));
	addChild(new SparseTextureClampLookupColorTestCase(m_context));
}